

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O1

double matd_vec_mag(matd_t *a)

{
  uint uVar1;
  ulong uVar2;
  double dVar3;
  
  if (a == (matd_t *)0x0) {
    __assert_fail("a != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                  ,0x34c,"double matd_vec_mag(const matd_t *)");
  }
  if ((a->ncols != 1) && (a->nrows != 1)) {
    __assert_fail("matd_is_vector(a)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                  ,0x34d,"double matd_vec_mag(const matd_t *)");
  }
  uVar1 = a->ncols * a->nrows;
  dVar3 = 0.0;
  if (0 < (int)uVar1) {
    uVar2 = 0;
    do {
      dVar3 = dVar3 + (double)a[uVar2 + 1] * (double)a[uVar2 + 1];
      uVar2 = uVar2 + 1;
    } while (uVar1 != uVar2);
  }
  if (0.0 <= dVar3) {
    return SQRT(dVar3);
  }
  dVar3 = sqrt(dVar3);
  return dVar3;
}

Assistant:

double matd_vec_mag(const matd_t *a)
{
    assert(a != NULL);
    assert(matd_is_vector(a));

    double mag = 0.0;
    int len = a->nrows*a->ncols;
    for (int i = 0; i < len; i++)
        mag += sq(a->data[i]);
    return sqrt(mag);
}